

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_lex.c
# Opt level: O0

YY_BUFFER_STATE easm__scan_buffer(char *base,yy_size_t size,yyscan_t yyscanner)

{
  YY_BUFFER_STATE b;
  yyscan_t yyscanner_local;
  yy_size_t size_local;
  char *base_local;
  
  if (((size < 2) || (base[size - 2] != '\0')) || (base[size - 1] != '\0')) {
    base_local = (char *)0x0;
  }
  else {
    base_local = (char *)easm_alloc(0x40,yyscanner);
    if ((YY_BUFFER_STATE)base_local == (YY_BUFFER_STATE)0x0) {
      yy_fatal_error("out of dynamic memory in yy_scan_buffer()",yyscanner);
    }
    ((YY_BUFFER_STATE)base_local)->yy_buf_size = (int)size + -2;
    ((YY_BUFFER_STATE)base_local)->yy_ch_buf = base;
    ((YY_BUFFER_STATE)base_local)->yy_buf_pos = base;
    ((YY_BUFFER_STATE)base_local)->yy_is_our_buffer = 0;
    ((YY_BUFFER_STATE)base_local)->yy_input_file = (FILE *)0x0;
    ((YY_BUFFER_STATE)base_local)->yy_n_chars = ((YY_BUFFER_STATE)base_local)->yy_buf_size;
    ((YY_BUFFER_STATE)base_local)->yy_is_interactive = 0;
    ((YY_BUFFER_STATE)base_local)->yy_at_bol = 1;
    ((YY_BUFFER_STATE)base_local)->yy_fill_buffer = 0;
    ((YY_BUFFER_STATE)base_local)->yy_buffer_status = 0;
    easm__switch_to_buffer((YY_BUFFER_STATE)base_local,yyscanner);
  }
  return (YY_BUFFER_STATE)base_local;
}

Assistant:

YY_BUFFER_STATE yy_scan_buffer  (char * base, yy_size_t  size , yyscan_t yyscanner)
{
	YY_BUFFER_STATE b;
    
	if ( size < 2 ||
	     base[size-2] != YY_END_OF_BUFFER_CHAR ||
	     base[size-1] != YY_END_OF_BUFFER_CHAR )
		/* They forgot to leave room for the EOB's. */
		return NULL;

	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state ) , yyscanner );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_buffer()" );

	b->yy_buf_size = (int) (size - 2);	/* "- 2" to take care of EOB's */
	b->yy_buf_pos = b->yy_ch_buf = base;
	b->yy_is_our_buffer = 0;
	b->yy_input_file = NULL;
	b->yy_n_chars = b->yy_buf_size;
	b->yy_is_interactive = 0;
	b->yy_at_bol = 1;
	b->yy_fill_buffer = 0;
	b->yy_buffer_status = YY_BUFFER_NEW;

	yy_switch_to_buffer( b , yyscanner );

	return b;
}